

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoSwitches.hpp
# Opt level: O0

void __thiscall
Apple::II::VideoSwitches<Cycles>::set_80_columns(VideoSwitches<Cycles> *this,bool columns_80)

{
  anon_class_16_2_0641d715 local_50;
  function<void_()> local_40;
  Cycles local_20;
  undefined1 local_11;
  VideoSwitches<Cycles> *pVStack_10;
  bool columns_80_local;
  VideoSwitches<Cycles> *this_local;
  
  (this->external_).columns_80 = columns_80;
  local_20.super_WrappedInt<Cycles>.length_ =
       (WrappedInt<Cycles>)(this->delay_).super_WrappedInt<Cycles>.length_;
  local_50.this = this;
  local_50.columns_80 = columns_80;
  local_11 = columns_80;
  pVStack_10 = this;
  std::function<void()>::
  function<Apple::II::VideoSwitches<Cycles>::set_80_columns(bool)::_lambda()_1_,void>
            ((function<void()> *)&local_40,&local_50);
  DeferredQueue<Cycles>::defer(&(this->deferrer_).super_DeferredQueue<Cycles>,local_20,&local_40);
  std::function<void_()>::~function(&local_40);
  return;
}

Assistant:

void set_80_columns(bool columns_80) {
			external_.columns_80 = columns_80;
			deferrer_.defer(delay_, [this, columns_80] {
				internal_.columns_80 = columns_80;
			});
		}